

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O2

void Omega_h::fix_for_given_metric(Mesh *mesh,AdaptOpts *adapt_opts,bool verbose)

{
  ostream *poVar1;
  undefined3 in_register_00000011;
  Real RVar2;
  Real RVar3;
  double dVar4;
  double local_190;
  AdaptOpts opts;
  
  if (CONCAT31(in_register_00000011,verbose) != 0) {
    std::operator<<((ostream *)&std::cout,"computing minimum quality\n");
  }
  RVar2 = Mesh::min_quality(mesh);
  local_190 = Mesh::max_length(mesh);
  if (verbose) {
    std::operator<<((ostream *)&std::cout,"minimum quality ");
    poVar1 = std::ostream::_M_insert<double>(RVar2);
    std::operator<<(poVar1,'\n');
    std::operator<<((ostream *)&std::cout,"maximum length ");
    poVar1 = std::ostream::_M_insert<double>(local_190);
    std::operator<<(poVar1,'\n');
  }
  AdaptOpts::AdaptOpts(&opts,adapt_opts);
  do {
    opts.max_length_allowed = opts.max_length_desired + opts.max_length_desired;
    if (opts.max_length_desired + opts.max_length_desired <= local_190) {
      opts.max_length_allowed = local_190;
    }
    opts.min_quality_allowed = RVar2;
    std::operator<<((ostream *)&std::cout,"max_length_allowed(");
    poVar1 = std::ostream::_M_insert<double>(opts.max_length_allowed);
    poVar1 = std::operator<<(poVar1,") = max(");
    std::operator<<(poVar1,"maxlen(");
    poVar1 = std::ostream::_M_insert<double>(local_190);
    std::operator<<(poVar1,"), max_length_desired*2(");
    poVar1 = std::ostream::_M_insert<double>(opts.max_length_desired + opts.max_length_desired);
    std::operator<<(poVar1,"))\n");
    opts.nsliver_layers = 10;
    opts.verbosity = EXTRA_STATS;
    opts.min_quality_desired = 1.0;
    if (RVar2 + 0.1 <= 1.0) {
      opts.min_quality_desired = RVar2 + 0.1;
    }
    adapt(mesh,&opts);
    RVar3 = Mesh::min_quality(mesh);
    local_190 = Mesh::max_length(mesh);
    if (verbose) {
      std::operator<<((ostream *)&std::cout,"minimum quality ");
      poVar1 = std::ostream::_M_insert<double>(RVar3);
      std::operator<<(poVar1,'\n');
      std::operator<<((ostream *)&std::cout,"maximum length ");
      poVar1 = std::ostream::_M_insert<double>(local_190);
      std::operator<<(poVar1,'\n');
    }
    dVar4 = RVar2 + 0.001;
    RVar2 = RVar3;
  } while (dVar4 <= RVar3);
  TransferOpts::~TransferOpts(&opts.xfer_opts);
  return;
}

Assistant:

void fix_for_given_metric(
    Mesh* mesh, AdaptOpts const& adapt_opts, bool verbose) {
  if (verbose) std::cout << "computing minimum quality\n";
  auto minqual = mesh->min_quality();
  auto maxlen = mesh->max_length();
  if (verbose) std::cout << "minimum quality " << minqual << '\n';
  if (verbose) std::cout << "maximum length " << maxlen << '\n';
  AdaptOpts opts = adapt_opts;
  while (true) {
    auto minqual_old = minqual;
    opts.min_quality_allowed = minqual;
    opts.max_length_allowed = max2(maxlen, opts.max_length_desired * 2.0);
    std::cout << "max_length_allowed(" << opts.max_length_allowed << ") = max("
              << "maxlen(" << maxlen << "), max_length_desired*2("
              << opts.max_length_desired * 2.0 << "))\n";
    opts.verbosity = EXTRA_STATS;
    opts.nsliver_layers = 10;
    opts.min_quality_desired = min2(minqual + 0.1, 1.0);
#ifdef OMEGA_H_USE_EGADS
    opts.allow_snap_failure = true;
#endif
    adapt(mesh, opts);
    minqual = mesh->min_quality();
    maxlen = mesh->max_length();
    if (verbose) std::cout << "minimum quality " << minqual << '\n';
    if (verbose) std::cout << "maximum length " << maxlen << '\n';
    if (minqual < minqual_old + 1e-3) break;  // stalled
  }
}